

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O1

int32_t __thiscall
icu_63::HebrewCalendar::handleGetMonthLength
          (HebrewCalendar *this,int32_t extendedYear,int32_t month)

{
  int iVar1;
  int iVar2;
  int8_t (*paiVar3) [3];
  ulong uVar4;
  undefined4 in_register_00000034;
  int iVar5;
  
  uVar4 = CONCAT44(in_register_00000034,extendedYear);
  if (month < 0) {
    iVar1 = extendedYear * 0xc + 5;
    do {
      uVar4 = (ulong)((int)uVar4 - 1);
      iVar5 = iVar1 % 0x13;
      iVar2 = 0xc;
      if (iVar5 < 0) {
        iVar2 = -7;
      }
      iVar1 = iVar1 + -0xc;
      month = month + (iVar5 < iVar2 ^ 0xd);
    } while (month < 0);
  }
  if (0xc < (uint)month) {
    iVar1 = (int)uVar4 * 0xc + 0x11;
    do {
      uVar4 = (ulong)((int)uVar4 + 1);
      iVar2 = 0xc;
      if (iVar1 % 0x13 < 0) {
        iVar2 = -7;
      }
      month = (month + (uint)(iVar1 % 0x13 < iVar2)) - 0xd;
      iVar1 = iVar1 + 0xc;
    } while (0xc < month);
  }
  if (month - 1U < 2) {
    iVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x23])(this,uVar4);
    iVar1 = iVar2 + -0x1e;
    if (iVar2 < 0x17d) {
      iVar1 = iVar2;
    }
    uVar4 = 1;
    if (iVar1 - 0x161U < 3) {
      uVar4 = (ulong)(iVar1 - 0x161U);
    }
    paiVar3 = (int8_t (*) [3])(MONTH_LENGTH[0] + uVar4);
  }
  else {
    paiVar3 = MONTH_LENGTH;
  }
  return (int)*(int8_t *)((long)paiVar3 + (ulong)(uint)month * 3);
}

Assistant:

int32_t HebrewCalendar::handleGetMonthLength(int32_t extendedYear, int32_t month) const {
    // Resolve out-of-range months.  This is necessary in order to
    // obtain the correct year.  We correct to
    // a 12- or 13-month year (add/subtract 12 or 13, depending
    // on the year) but since we _always_ number from 0..12, and
    // the leap year determines whether or not month 5 (Adar 1)
    // is present, we allow 0..12 in any given year.
    while (month < 0) {
        month += monthsInYear(--extendedYear);
    }
    // Careful: allow 0..12 in all years
    while (month > 12) {
        month -= monthsInYear(extendedYear++);
    }

    switch (month) {
    case HESHVAN:
    case KISLEV:
      // These two month lengths can vary
      return MONTH_LENGTH[month][yearType(extendedYear)];

    default:
      // The rest are a fixed length
      return MONTH_LENGTH[month][0];
    }
}